

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep.c
# Opt level: O0

int mriStepInnerStepper_AllocVecs(MRIStepInnerStepper stepper,int count,N_Vector tmpl)

{
  int iVar1;
  MRIStepInnerStepper stepper_00;
  void *pvVar2;
  N_Vector **in_RDX;
  int in_ESI;
  long in_RDI;
  long *unaff_retaddr;
  sunindextype liw1;
  sunindextype lrw1;
  sunindextype *in_stack_ffffffffffffffc8;
  N_Vector in_stack_ffffffffffffffd0;
  undefined4 local_28;
  sunindextype in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe8;
  int local_4;
  
  if (in_RDI == 0) {
    local_4 = -0x16;
  }
  else {
    if (in_RDX[1][4] == (N_Vector)0x0) {
      in_stack_ffffffffffffffdc = 0;
      local_28 = 0;
    }
    else {
      N_VSpace(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,(sunindextype *)0x1157dbb);
    }
    *(sunindextype *)(in_RDI + 0x48) = in_stack_ffffffffffffffdc;
    *(undefined4 *)(in_RDI + 0x4c) = local_28;
    *(int *)(in_RDI + 0x20) = in_ESI;
    stepper_00 = (MRIStepInnerStepper)(in_RDI + 0x58);
    iVar1 = arkAllocVecArray((int)in_RDI,(N_Vector)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),in_RDX
                             ,in_stack_ffffffffffffffdc,(long *)in_stack_ffffffffffffffd0,
                             (sunindextype)((ulong)stepper_00 >> 0x20),unaff_retaddr);
    if (iVar1 == 0) {
      mriStepInnerStepper_FreeVecs(stepper_00);
      local_4 = -0x14;
    }
    else {
      if (*(long *)(in_RDI + 0x40) == 0) {
        pvVar2 = calloc((long)(in_ESI + 1),8);
        *(void **)(in_RDI + 0x40) = pvVar2;
        if (*(long *)(in_RDI + 0x40) == 0) {
          mriStepInnerStepper_FreeVecs(stepper_00);
          return -0x14;
        }
      }
      if (*(long *)(in_RDI + 0x38) == 0) {
        pvVar2 = calloc((long)(in_ESI + 1),8);
        *(void **)(in_RDI + 0x38) = pvVar2;
        if (*(long *)(in_RDI + 0x38) == 0) {
          mriStepInnerStepper_FreeVecs(stepper_00);
          return -0x14;
        }
      }
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int mriStepInnerStepper_AllocVecs(MRIStepInnerStepper stepper, int count,
                                  N_Vector tmpl)
{
  sunindextype lrw1, liw1;

  if (stepper == NULL) return ARK_ILL_INPUT;

  /* Set space requirements for one N_Vector */
  if (tmpl->ops->nvspace) {
    N_VSpace(tmpl, &lrw1, &liw1);
  } else {
    lrw1 = 0;
    liw1 = 0;
  }
  stepper->lrw1 = lrw1;
  stepper->liw1 = liw1;

  /* Set the number of forcing vectors and allocate vectors */
  stepper->nforcing = count;

  if (!arkAllocVecArray(count,
                        tmpl, &(stepper->forcing),
                        stepper->lrw1, &(stepper->lrw),
                        stepper->liw1, &(stepper->liw))) {
    mriStepInnerStepper_FreeVecs(stepper);
    return(ARK_MEM_FAIL);
  }

  /* Allocate fused operation workspace arrays */
  if (stepper->vecs == NULL) {
    stepper->vecs = (N_Vector *) calloc(count + 1, sizeof(N_Vector));
    if (stepper->vecs == NULL) {
      mriStepInnerStepper_FreeVecs(stepper);
      return(ARK_MEM_FAIL);
    }
  }

  if (stepper->vals == NULL) {
    stepper->vals = (realtype *) calloc(count + 1, sizeof(realtype));
    if (stepper->vals == NULL) {
      mriStepInnerStepper_FreeVecs(stepper);
      return(ARK_MEM_FAIL);
    }
  }

  return(ARK_SUCCESS);
}